

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  uint uVar1;
  ImFont **__src;
  ImFontConfig *__src_00;
  int iVar2;
  ImFont *pIVar3;
  ImFont **__dest;
  ImFontConfig *pIVar4;
  long lVar5;
  void *__dest_00;
  int iVar6;
  char *__function;
  int iVar7;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x80f,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x810,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x811,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    pIVar3 = (ImFont *)ImGui::MemAlloc(0x70);
    (pIVar3->IndexAdvanceX).Size = 0;
    (pIVar3->IndexAdvanceX).Capacity = 0;
    (pIVar3->IndexAdvanceX).Data = (float *)0x0;
    pIVar3->FallbackAdvanceX = 0.0;
    pIVar3->FontSize = 0.0;
    (pIVar3->IndexLookup).Size = 0;
    (pIVar3->IndexLookup).Capacity = 0;
    (pIVar3->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar3->Glyphs).Size = 0;
    (pIVar3->Glyphs).Capacity = 0;
    (pIVar3->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar3->FallbackChar = 0x3f;
    pIVar3->EllipsisChar = 0xffff;
    pIVar3->DirtyLookupTables = false;
    pIVar3->FallbackGlyph = (ImFontGlyph *)0x0;
    pIVar3->ContainerAtlas = (ImFontAtlas *)0x0;
    *(undefined8 *)((long)&pIVar3->ContainerAtlas + 2) = 0;
    *(undefined8 *)((long)&pIVar3->ConfigData + 2) = 0;
    pIVar3->Scale = 1.0;
    pIVar3->Ascent = 0.0;
    pIVar3->Descent = 0.0;
    *(undefined8 *)((long)&pIVar3->Descent + 2) = 0;
    iVar2 = (this->Fonts).Size;
    if (iVar2 == (this->Fonts).Capacity) {
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      iVar7 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar7 = iVar6;
      }
      __dest = (ImFont **)ImGui::MemAlloc((long)iVar7 << 3);
      __src = (this->Fonts).Data;
      if (__src != (ImFont **)0x0) {
        memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
        ImGui::MemFree((this->Fonts).Data);
      }
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar7;
      iVar2 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    __dest[iVar2] = pIVar3;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  else if ((this->Fonts).Size == 0) {
    __assert_fail("!Fonts.empty() && \"Cannot use MergeMode for the first font\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0x817,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  iVar2 = (this->ConfigData).Size;
  if (iVar2 == (this->ConfigData).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    pIVar4 = (ImFontConfig *)ImGui::MemAlloc((long)iVar7 * 0x88);
    __src_00 = (this->ConfigData).Data;
    if (__src_00 != (ImFontConfig *)0x0) {
      memcpy(pIVar4,__src_00,(long)(this->ConfigData).Size * 0x88);
      ImGui::MemFree((this->ConfigData).Data);
    }
    (this->ConfigData).Data = pIVar4;
    (this->ConfigData).Capacity = iVar7;
    iVar2 = (this->ConfigData).Size;
  }
  else {
    pIVar4 = (this->ConfigData).Data;
  }
  memcpy(pIVar4 + iVar2,font_cfg,0x88);
  iVar2 = (this->ConfigData).Size;
  uVar1 = iVar2 + 1;
  (this->ConfigData).Size = uVar1;
  if (-1 < iVar2) {
    pIVar4 = (this->ConfigData).Data;
    pIVar3 = pIVar4[(ulong)uVar1 - 1].DstFont;
    if (pIVar3 == (ImFont *)0x0) {
      lVar5 = (long)(this->Fonts).Size;
      if (lVar5 < 1) {
        __function = "T &ImVector<ImFont *>::back() [T = ImFont *]";
        goto LAB_00131aaa;
      }
      pIVar3 = (this->Fonts).Data[lVar5 + -1];
      pIVar4[(ulong)uVar1 - 1].DstFont = pIVar3;
    }
    if (pIVar4[(ulong)uVar1 - 1].FontDataOwnedByAtlas == false) {
      __dest_00 = ImGui::MemAlloc((long)pIVar4[(ulong)uVar1 - 1].FontDataSize);
      pIVar4[(ulong)uVar1 - 1].FontData = __dest_00;
      pIVar4[(ulong)uVar1 - 1].FontDataOwnedByAtlas = true;
      memcpy(__dest_00,font_cfg->FontData,(long)pIVar4[(ulong)uVar1 - 1].FontDataSize);
      pIVar3 = pIVar4[(ulong)uVar1 - 1].DstFont;
    }
    if (pIVar3->EllipsisChar == 0xffff) {
      pIVar3->EllipsisChar = font_cfg->EllipsisChar;
    }
    ClearTexData(this);
    return pIVar4[(ulong)uVar1 - 1].DstFont;
  }
  __function = "T &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_00131aaa:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,__function);
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}